

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_has_xpath(lys_node *node)

{
  LYS_NODE LVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  lys_node *node_local;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xd94,"int lys_has_xpath(const struct lys_node *)");
  }
  LVar1 = node->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    if ((node[1].name != (char *)0x0) || (node->padding[1] != '\0')) {
      return 1;
    }
  }
  else if (LVar1 == LYS_CHOICE) {
    lVar3._0_1_ = node->hash[0];
    lVar3._1_1_ = node->hash[1];
    lVar3._2_1_ = node->hash[2];
    lVar3._3_1_ = node->hash[3];
    lVar3._4_4_ = *(undefined4 *)&node->field_0x6c;
    if (lVar3 != 0) {
      return 1;
    }
  }
  else if (LVar1 == LYS_LEAF) {
    if ((node[1].name != (char *)0x0) || (node->padding[3] != '\0')) {
      return 1;
    }
  }
  else if (LVar1 == LYS_LEAFLIST) {
    if ((node[1].name != (char *)0x0) || (node->padding[3] != '\0')) {
      return 1;
    }
  }
  else if (LVar1 == LYS_LIST) {
    if ((node[1].name != (char *)0x0) || (node->padding[0] != '\0')) {
      return 1;
    }
  }
  else if (LVar1 == LYS_CASE) {
    lVar2._0_1_ = node->hash[0];
    lVar2._1_1_ = node->hash[1];
    lVar2._2_1_ = node->hash[2];
    lVar2._3_1_ = node->hash[3];
    lVar2._4_4_ = *(undefined4 *)&node->field_0x6c;
    if (lVar2 != 0) {
      return 1;
    }
  }
  else if (LVar1 == LYS_NOTIF) {
    if (node->padding[1] != '\0') {
      return 1;
    }
  }
  else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
    if (node->padding[1] != '\0') {
      return 1;
    }
  }
  else if (LVar1 == LYS_USES) {
    lVar4._0_1_ = node->hash[0];
    lVar4._1_1_ = node->hash[1];
    lVar4._2_1_ = node->hash[2];
    lVar4._3_1_ = node->hash[3];
    lVar4._4_4_ = *(undefined4 *)&node->field_0x6c;
    if (lVar4 != 0) {
      return 1;
    }
  }
  else if (LVar1 == LYS_AUGMENT) {
    if (node->next != (lys_node *)0x0) {
      return 1;
    }
  }
  else if ((LVar1 == LYS_ANYDATA) && ((node[1].name != (char *)0x0 || (node->padding[3] != '\0'))))
  {
    return 1;
  }
  return 0;
}

Assistant:

int
lys_has_xpath(const struct lys_node *node)
{
    assert(node);

    switch (node->nodetype) {
    case LYS_AUGMENT:
        if (((struct lys_node_augment *)node)->when) {
            return 1;
        }
        break;
    case LYS_CASE:
        if (((struct lys_node_case *)node)->when) {
            return 1;
        }
        break;
    case LYS_CHOICE:
        if (((struct lys_node_choice *)node)->when) {
            return 1;
        }
        break;
    case LYS_ANYDATA:
        if (((struct lys_node_anydata *)node)->when || ((struct lys_node_anydata *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAF:
        if (((struct lys_node_leaf *)node)->when || ((struct lys_node_leaf *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAFLIST:
        if (((struct lys_node_leaflist *)node)->when || ((struct lys_node_leaflist *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node)->when || ((struct lys_node_list *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->when || ((struct lys_node_container *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        if (((struct lys_node_inout *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_NOTIF:
        if (((struct lys_node_notif *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_USES:
        if (((struct lys_node_uses *)node)->when) {
            return 1;
        }
        break;
    default:
        /* does not have XPath */
        break;
    }

    return 0;
}